

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

void __thiscall
avro::GenericDatum::GenericDatum<avro::GenericEnum>
          (GenericDatum *this,NodePtr *schema,GenericEnum *v)

{
  GenericEnum *this_00;
  
  this->type_ = schema->px->type_;
  (this->value_).content = (placeholder *)0x0;
  init(this,(EVP_PKEY_CTX *)schema);
  this_00 = boost::any_cast<avro::GenericEnum>(&this->value_);
  GenericEnum::operator=(this_00,v);
  return;
}

Assistant:

GenericDatum(const NodePtr& schema, const T& v) :
        type_(schema->type()) {
        init(schema);
        value<T>() = v;
    }